

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O1

Status * google::protobuf::util::converter::anon_unknown_8::WriteFloat
                   (Status *__return_storage_ptr__,int field_number,DataPiece *data,
                   CodedOutputStream *stream)

{
  undefined1 local_58 [8];
  StatusOr<float> f;
  
  DataPiece::ToFloat((StatusOr<float> *)local_58,data);
  if (local_58._0_4_ == OK) {
    protobuf::internal::WireFormatLite::WriteFloat
              (field_number,(float)f.status_.error_message_.field_2._8_4_,stream);
  }
  Status::Status(__return_storage_ptr__,(Status *)local_58);
  if ((size_type *)f.status_._0_8_ != &f.status_.error_message_._M_string_length) {
    operator_delete((void *)f.status_._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Status WriteFloat(int field_number, const DataPiece& data,
                         CodedOutputStream* stream) {
  StatusOr<float> f = data.ToFloat();
  if (f.ok()) {
    WireFormatLite::WriteFloat(field_number, f.value(), stream);
  }
  return f.status();
}